

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O3

XMLCh * __thiscall
xercesc_4_0::XMLDateTime::getTimeCanonicalRepresentation(XMLDateTime *this,MemoryManager *memMgr)

{
  int iVar1;
  XMLCh *pXVar2;
  int iVar3;
  undefined4 extraout_var;
  XMLSize_t maxChars;
  XMLCh *miliEndPtr;
  XMLCh *miliStartPtr;
  XMLCh *local_48;
  XMLCh *local_40;
  XMLCh *local_38;
  
  searchMiliSeconds(this,&local_38,&local_40);
  maxChars = (long)local_40 - (long)local_38 >> 1;
  iVar1 = this->fValue[7];
  if (memMgr == (MemoryManager *)0x0) {
    memMgr = this->fMemoryManager;
  }
  iVar3 = (*memMgr->_vptr_MemoryManager[3])
                    (memMgr,((maxChars + 1) - (ulong)(iVar1 == 0)) * 2 + 0x16);
  local_48 = (XMLCh *)CONCAT44(extraout_var,iVar3);
  fillString(this,&local_48,this->fValue[3],2);
  if (this->fValue[3] == 0x18) {
    local_48[-2] = L'0';
    local_48[-1] = L'0';
  }
  *local_48 = L':';
  local_48 = local_48 + 1;
  fillString(this,&local_48,this->fValue[4],2);
  *local_48 = L':';
  local_48 = local_48 + 1;
  fillString(this,&local_48,this->fValue[5],2);
  pXVar2 = local_48;
  if (local_40 != local_38) {
    *local_48 = L'.';
    XMLString::copyNString(local_48 + 1,local_38,maxChars);
    local_48 = (XMLCh *)((long)pXVar2 + ((long)local_40 - (long)local_38) + 2);
  }
  if (iVar1 != 0) {
    *local_48 = L'Z';
    local_48 = local_48 + 1;
  }
  *local_48 = L'\0';
  return (XMLCh *)CONCAT44(extraout_var,iVar3);
}

Assistant:

XMLCh* XMLDateTime::getTimeCanonicalRepresentation(MemoryManager* const memMgr) const
{
    XMLCh *miliStartPtr, *miliEndPtr;
    searchMiliSeconds(miliStartPtr, miliEndPtr);
    XMLSize_t miliSecondsLen = miliEndPtr - miliStartPtr;
    int utcSize = (fValue[utc] == UTC_UNKNOWN) ? 0 : 1;

    MemoryManager* toUse = memMgr? memMgr : fMemoryManager;
    XMLCh* retBuf = (XMLCh*) toUse->allocate( (10 + miliSecondsLen + utcSize + 1) * sizeof(XMLCh));
    XMLCh* retPtr = retBuf;

    // 'hh:mm:ss'Z'    ('.'s+)?
    //      8    1
    //

    fillString(retPtr, fValue[Hour], 2);
    if (fValue[Hour] == 24)
    {
        *(retPtr - 2) = chDigit_0;
        *(retPtr - 1) = chDigit_0;
    }
    *retPtr++ = TIME_SEPARATOR;
    fillString(retPtr, fValue[Minute], 2);
    *retPtr++ = TIME_SEPARATOR;
    fillString(retPtr, fValue[Second], 2);

    if (miliSecondsLen)
    {
        *retPtr++ = chPeriod;
        XMLString::copyNString(retPtr, miliStartPtr, miliSecondsLen);
        retPtr += miliSecondsLen;
    }

    if (utcSize)
        *retPtr++ = UTC_STD_CHAR;
    *retPtr = chNull;

    return retBuf;
}